

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CardGroup.cpp
# Opt level: O3

Card * __thiscall CardGroup::first(CardGroup *this)

{
  pointer ppCVar1;
  Card *pCVar2;
  ulong uVar3;
  
  uVar3 = (ulong)this->top;
  ppCVar1 = (this->cards).super__Vector_base<Card_*,_std::allocator<Card_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  while( true ) {
    if ((ulong)((long)(this->cards).super__Vector_base<Card_*,_std::allocator<Card_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppCVar1 >> 3) <= uVar3) {
      return (Card *)0x0;
    }
    pCVar2 = ppCVar1[uVar3];
    if (pCVar2 != (Card *)0x0) break;
    uVar3 = uVar3 + 1;
  }
  return pCVar2;
}

Assistant:

Card * CardGroup::first() const {
        if(top >= this->cards.size()) return NULL;
        int pos = top;
        while(this->cards[pos] == NULL) {
                pos++;
                if(pos >= this->cards.size()) return NULL;
        }
        return this->cards[pos];
}